

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# density_common.h
# Opt level: O2

void __thiscall
density_tests::
aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>
::deallocate(aligned_allocator<density_tests::QueueGenericTester<density::sp_heter_queue<density_tests::TestRuntimeTime<density::runtime_type<density::feature_list<density::f_size,_density::f_alignment,_density::f_copy_construct,_density::f_move_construct,_density::f_rtti,_density::f_destroy>_>_>,_density_tests::DeepTestAllocator<256UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_density::default_busy_wait>_>::ThreadData>
             *this,ThreadData *i_block,size_t i_count)

{
  if (i_block != (ThreadData *)0x0) {
    operator_delete(*(void **)&i_block[-1].field_0x1438);
    return;
  }
  return;
}

Assistant:

inline void aligned_deallocate(
      void * i_block, size_t i_size, size_t i_alignment, size_t i_alignment_offset = 0) noexcept
    {
        DENSITY_ASSERT(is_power_of_2(i_alignment));
        DENSITY_ASSUME(i_alignment > 0);

        if (i_alignment <= detail::MaxAlignment && i_alignment_offset == 0)
        {
#if __cpp_sized_deallocation >= 201309
            operator delete(i_block, i_size); // since C++14
#else
            (void)i_size;
            operator delete(i_block);
#endif
        }
        else
        {
            if (i_block != nullptr)
            {
                const auto & header = *(static_cast<detail::AlignmentHeader *>(i_block) - 1);
#if __cpp_sized_deallocation >= 201309 // since C++14
                size_t const extra_size =
                  detail::size_max(i_alignment, sizeof(detail::AlignmentHeader));
                size_t const actual_size = i_size + extra_size;
                             operator delete(header.m_block, actual_size);
#else
                (void)i_size;
                operator delete(header.m_block);
#endif
            }
        }
    }